

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::IntegerFunctionTestInstance::IntegerFunctionTestInstance
          (IntegerFunctionTestInstance *this,Context *context,ShaderType shaderType,ShaderSpec *spec
          ,int numValues,char *name)

{
  pointer pcVar1;
  ShaderExecutor *pSVar2;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__IntegerFunctionTestInstance_00d3a860;
  this->m_shaderType = shaderType;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::vector
            (&(this->m_spec).inputs,&spec->inputs);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::vector
            (&(this->m_spec).outputs,&spec->outputs);
  (this->m_spec).globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->m_spec).globalDeclarations.field_2;
  pcVar1 = (spec->globalDeclarations)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_spec).globalDeclarations,pcVar1,
             pcVar1 + (spec->globalDeclarations)._M_string_length);
  (this->m_spec).source._M_dataplus._M_p = (pointer)&(this->m_spec).source.field_2;
  pcVar1 = (spec->source)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_spec).source,pcVar1,pcVar1 + (spec->source)._M_string_length);
  this->m_numValues = numValues;
  this->m_name = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_failMsg);
  pSVar2 = createExecutor(context,this->m_shaderType,&this->m_spec,(VkDescriptorSetLayout)0x0);
  (this->m_executor).
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = pSVar2;
  return;
}

Assistant:

IntegerFunctionTestInstance		(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
									: TestInstance	(context)
									, m_shaderType	(shaderType)
									, m_spec		(spec)
									, m_numValues	(numValues)
									, m_name		(name)
									, m_executor	(createExecutor(context, m_shaderType, m_spec))
								{
								}